

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::Texture3D::Texture3D
          (Texture3D *this,RenderContext *context,deUint32 sizedFormat,int width,int height,
          int depth)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  Functions *gl;
  int local_28;
  int local_24;
  int depth_local;
  int height_local;
  int width_local;
  deUint32 sizedFormat_local;
  RenderContext *context_local;
  Texture3D *this_local;
  
  this->m_context = context;
  this->m_isCompressed = false;
  this->m_format = sizedFormat;
  local_28 = depth;
  local_24 = height;
  depth_local = width;
  height_local = sizedFormat;
  _width_local = context;
  context_local = (RenderContext *)this;
  gl = (Functions *)mapGLInternalFormat(sizedFormat);
  tcu::Texture3D::Texture3D(&this->m_refTexture,(TextureFormat *)&gl,depth_local,local_24,local_28);
  this->m_glTexture = 0;
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x29c);
  return;
}

Assistant:

Texture3D::Texture3D (const RenderContext& context, deUint32 sizedFormat, int width, int height, int depth)
	: m_context			(context)
	, m_isCompressed	(false)
	, m_format			(sizedFormat)
	, m_refTexture		(mapGLInternalFormat(sizedFormat), width, height, depth)
	, m_glTexture		(0)
{
	// \todo [2013-04-08 pyry] Check support here.
	const glw::Functions& gl = m_context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}